

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

void act_var_bump(sat_solver3 *s,int v)

{
  word wVar1;
  xdbl xVar2;
  double dVar3;
  double dVar4;
  double act;
  int v_local;
  sat_solver3 *s_local;
  
  if (s->VarActType == 0) {
    s->activity[v] = s->var_inc + s->activity[v];
    if ((s->activity[v] & 0x80000000) != 0) {
      act_var_rescale(s);
    }
    if (s->orderpos[v] != -1) {
      order_update(s,v);
    }
  }
  else if (s->VarActType == 1) {
    dVar3 = Abc_Word2Dbl(s->activity[v]);
    dVar4 = Abc_Word2Dbl(s->var_inc);
    wVar1 = Abc_Dbl2Word(dVar3 + dVar4);
    s->activity[v] = wVar1;
    if (1e+100 < dVar3 + dVar4) {
      act_var_rescale(s);
    }
    if (s->orderpos[v] != -1) {
      order_update(s,v);
    }
  }
  else {
    if (s->VarActType != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x146,"void act_var_bump(sat_solver3 *, int)");
    }
    xVar2 = Xdbl_Add(s->activity[v],s->var_inc);
    s->activity[v] = xVar2;
    if (0x14c924d692ca61b < s->activity[v]) {
      act_var_rescale(s);
    }
    if (s->orderpos[v] != -1) {
      order_update(s,v);
    }
  }
  return;
}

Assistant:

static inline void act_var_bump(sat_solver3* s, int v) 
{
    if ( s->VarActType == 0 )
    {
        s->activity[v] += s->var_inc;
        if ((unsigned)s->activity[v] & 0x80000000)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 1 )
    {
        double act = Abc_Word2Dbl(s->activity[v]) + Abc_Word2Dbl(s->var_inc);
        s->activity[v] = Abc_Dbl2Word(act);
        if (act > 1e100)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 2 )
    {
        s->activity[v] = Xdbl_Add( s->activity[v], s->var_inc );
        if (s->activity[v] > ABC_CONST(0x014c924d692ca61b))
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else assert(0);
}